

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

void __thiscall pbrt::BDPTIntegrator::Render(BDPTIntegrator *this)

{
  Tuple2<pbrt::Point2,_int> fullResolution;
  pointer pFVar1;
  pointer pFVar2;
  RGBColorSpace *colorSpace;
  int iVar3;
  undefined8 *puVar4;
  Allocator AVar5;
  RGBFilm *this_00;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  PixelSensor *in_R9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uintptr_t iptr;
  Bounds2i pixelBounds;
  int local_2f4;
  int t;
  int local_2ec;
  ulong local_2e8;
  BDPTIntegrator *local_2e0;
  float local_2d4;
  vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_> *local_2d0;
  FilterHandle local_2c8;
  string filename;
  FilmBaseParameters p;
  _Rb_tree_node_base local_1c8;
  size_t local_1a8;
  string local_1a0;
  undefined1 local_180 [80];
  ImageMetadata local_130;
  
  local_2e0 = this;
  if ((this->visualizeStrategies != false) || (this->visualizeWeights == true)) {
    local_2d0 = &this->weightFilms;
    std::vector<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>::resize
              (local_2d0,(long)(((this->maxDepth + 6) * (this->maxDepth + 1)) / 2));
    local_2e8 = 0x1000000000000;
    for (iVar3 = 0; local_2ec = iVar3, iVar3 <= this->maxDepth; iVar3 = iVar3 + 1) {
      iVar6 = 0;
      while( true ) {
        iVar7 = (iVar3 + 2) - iVar6;
        local_2f4 = iVar6;
        if (iVar3 + 2 < iVar6) break;
        t = iVar7;
        if (iVar7 != 0) {
          if (iVar6 == 1) {
            local_2f4 = 1;
            if (iVar7 == 1) goto LAB_0043bcb2;
          }
          local_2f4 = iVar6;
          StringPrintf<int&,int&,int&>
                    (&filename,(pbrt *)"bdpt_d%02i_s%02i_t%02i.exr",(char *)&local_2ec,&local_2f4,&t
                     ,(int *)in_R9);
          uVar8 = (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  .bits & 0xffffffffffff;
          fullResolution =
               *(Tuple2<pbrt::Point2,_int> *)(*(ulong *)(uVar8 + 0x340) & 0xffffffffffff);
          uVar10 = fullResolution.x;
          uVar11 = 0;
          if (0 < (int)uVar10) {
            uVar11 = (ulong)fullResolution & 0xffffffff;
          }
          uVar13 = fullResolution.y;
          uVar12 = 0;
          if (uVar13 != 0 && -1 < (long)fullResolution) {
            uVar12 = (ulong)uVar13;
          }
          puVar4 = (undefined8 *)operator_new(8);
          *puVar4 = 0x3f0000003f000000;
          local_2c8.
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          .bits = (TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                   )((ulong)puVar4 | local_2e8);
          local_2d4 = *(float *)((*(ulong *)(uVar8 + 0x340) & 0xffffffffffff) + 0x20) * 1000.0;
          AVar5.memoryResource = pstd::pmr::new_delete_resource();
          in_R9 = PixelSensor::CreateDefault(AVar5);
          std::__cxx11::string::string((string *)&local_1a0,(string *)&filename);
          pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar10 >> 0x1f & uVar10;
          pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar13 >> 0x1f & uVar13;
          pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int> =
               (Tuple2<pbrt::Point2,_int>)(uVar11 | uVar12 << 0x20);
          FilmBaseParameters::FilmBaseParameters
                    (&p,(Point2i)fullResolution,pixelBounds,&local_2c8,local_2d4,in_R9,&local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
          this_00 = (RGBFilm *)operator_new(0xa8);
          FilmBaseParameters::FilmBaseParameters((FilmBaseParameters *)local_180,&p);
          colorSpace = RGBColorSpace::sRGB;
          AVar5.memoryResource = pstd::pmr::new_delete_resource();
          RGBFilm::RGBFilm(this_00,(FilmBaseParameters *)local_180,colorSpace,INFINITY,true,AVar5);
          (local_2d0->super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>).
          _M_impl.super__Vector_impl_data._M_start
          [((t + 3 + local_2f4) * (t + -2 + local_2f4)) / 2 + local_2f4].
          super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits = (ulong)this_00 | local_2e8;
          std::__cxx11::string::~string((string *)(local_180 + 0x30));
          std::__cxx11::string::~string((string *)&p.filename);
          std::__cxx11::string::~string((string *)&filename);
          this = local_2e0;
          iVar3 = local_2ec;
        }
LAB_0043bcb2:
        iVar6 = local_2f4 + 1;
      }
    }
  }
  ImageTileIntegrator::Render((ImageTileIntegrator *)this);
  if ((this->visualizeStrategies != false) || (this->visualizeWeights == true)) {
    iVar3 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
            ::Dispatch<pbrt::SamplerHandle::SamplesPerPixel()const::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                        *)&(this->super_RayIntegrator).super_ImageTileIntegrator.samplerPrototype);
    lVar9 = 0;
    uVar8 = 0;
    local_2e8 = CONCAT44(local_2e8._4_4_,1.0 / (float)iVar3);
    while( true ) {
      pFVar1 = (local_2e0->weightFilms).
               super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar2 = (local_2e0->weightFilms).
               super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)((long)pFVar2 - (long)pFVar1 >> 3) <= uVar8) break;
      p.fullResolution.super_Tuple2<pbrt::Point2,_int>.y._0_1_ = 0;
      p.filename.field_2._M_local_buf[8] = '\0';
      local_1c8._M_color = _S_red;
      local_1c8._M_parent = (_Base_ptr)0x0;
      local_1a8 = 0;
      local_1c8._M_left = &local_1c8;
      local_1c8._M_right = &local_1c8;
      if ((*(ulong *)((long)&(pFVar1->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits +
                     lVar9) & 0xffffffffffff) != 0) {
        ImageMetadata::ImageMetadata(&local_130,(ImageMetadata *)&p);
        FilmHandle::WriteImage
                  ((FilmHandle *)
                   ((long)&(pFVar1->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits +
                   lVar9),&local_130,(Float)local_2e8);
        ImageMetadata::~ImageMetadata(&local_130);
      }
      ImageMetadata::~ImageMetadata((ImageMetadata *)&p);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 8;
    }
    if (pFVar2 != pFVar1) {
      (local_2e0->weightFilms).
      super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pFVar1;
    }
  }
  return;
}

Assistant:

void BDPTIntegrator::Render() {
    // Allocate buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const int bufferCount = (1 + maxDepth) * (6 + maxDepth) / 2;
        weightFilms.resize(bufferCount);
        for (int depth = 0; depth <= maxDepth; ++depth) {
            for (int s = 0; s <= depth + 2; ++s) {
                int t = depth + 2 - s;
                if (t == 0 || (s == 1 && t == 1))
                    continue;

                std::string filename =
                    StringPrintf("bdpt_d%02i_s%02i_t%02i.exr", depth, s, t);

                FilmBaseParameters p(
                    camera.GetFilm().FullResolution(),
                    Bounds2i(Point2i(0, 0), camera.GetFilm().FullResolution()),
                    new BoxFilter,  // FIXME: leaks
                    camera.GetFilm().Diagonal() * 1000, PixelSensor::CreateDefault(),
                    filename);
                weightFilms[BufferIndex(s, t)] = new RGBFilm(p, RGBColorSpace::sRGB);
            }
        }
    }

    RayIntegrator::Render();

    // Write buffers for debug visualization
    if (visualizeStrategies || visualizeWeights) {
        const Float invSampleCount = 1.0f / samplerPrototype.SamplesPerPixel();
        for (size_t i = 0; i < weightFilms.size(); ++i) {
            ImageMetadata metadata;
            if (weightFilms[i])
                weightFilms[i].WriteImage(metadata, invSampleCount);
        }
        weightFilms.clear();
    }
}